

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O0

vector<void_*,_std::allocator<void_*>_> *
deqp::gles31::bb::anon_unknown_11::mapBuffers
          (vector<void_*,_std::allocator<void_*>_> *__return_storage_ptr__,Functions *gl,
          vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
          *buffers,deUint32 access)

{
  pointer pBVar1;
  deUint32 err;
  deBool dVar2;
  size_type sVar3;
  const_reference pvVar4;
  value_type pvVar5;
  reference ppvVar6;
  TestError *this;
  int local_48;
  int ndx_1;
  int ndx;
  allocator<void_*> local_31;
  value_type local_30;
  undefined1 local_25;
  deUint32 local_24;
  vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
  *pvStack_20;
  deUint32 access_local;
  vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
  *buffers_local;
  Functions *gl_local;
  vector<void_*,_std::allocator<void_*>_> *mapPtrs;
  
  local_25 = 0;
  local_24 = access;
  pvStack_20 = buffers;
  buffers_local =
       (vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
        *)gl;
  gl_local = (Functions *)__return_storage_ptr__;
  sVar3 = std::
          vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
          ::size(buffers);
  local_30 = (value_type)0x0;
  std::allocator<void_*>::allocator(&local_31);
  std::vector<void_*,_std::allocator<void_*>_>::vector
            (__return_storage_ptr__,sVar3,&local_30,&local_31);
  std::allocator<void_*>::~allocator(&local_31);
  local_48 = 0;
  do {
    sVar3 = std::
            vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
            ::size(pvStack_20);
    if ((int)sVar3 <= local_48) {
      return __return_storage_ptr__;
    }
    pvVar4 = std::
             vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
             ::operator[](pvStack_20,(long)local_48);
    if (pvVar4->size < 1) {
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (__return_storage_ptr__,(long)local_48);
      *ppvVar6 = (value_type)0x0;
    }
    else {
      pBVar1 = buffers_local[2].
               super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar4 = std::
               vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
               ::operator[](pvStack_20,(long)local_48);
      (*(code *)pBVar1)(0x90d2,pvVar4->buffer);
      pBVar1 = buffers_local[0x8a].
               super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
      pvVar4 = std::
               vector<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
               ::operator[](pvStack_20,(long)local_48);
      pvVar5 = (value_type)(*(code *)pBVar1)(0x90d2,0,(long)pvVar4->size,local_24);
      ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                          (__return_storage_ptr__,(long)local_48);
      *ppvVar6 = pvVar5;
      err = (*(code *)buffers_local[0x55].
                      super__Vector_base<deqp::gles31::bb::(anonymous_namespace)::Buffer,_std::allocator<deqp::gles31::bb::(anonymous_namespace)::Buffer>_>
                      ._M_impl.super__Vector_impl_data._M_finish)();
      glu::checkError(err,"Failed to map buffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                      ,0x7c6);
      do {
        dVar2 = ::deGetFalse();
        if ((dVar2 != 0) ||
           (ppvVar6 = std::vector<void_*,_std::allocator<void_*>_>::operator[]
                                (__return_storage_ptr__,(long)local_48), *ppvVar6 == (value_type)0x0
           )) {
          this = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this,(char *)0x0,"mapPtrs[ndx]",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSSBOLayoutCase.cpp"
                     ,0x7c7);
          __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        dVar2 = ::deGetFalse();
      } while (dVar2 != 0);
    }
    local_48 = local_48 + 1;
  } while( true );
}

Assistant:

vector<void*> mapBuffers (const glw::Functions& gl, const vector<Buffer>& buffers, deUint32 access)
{
	vector<void*> mapPtrs(buffers.size(), DE_NULL);

	try
	{
		for (int ndx = 0; ndx < (int)buffers.size(); ndx++)
		{
			if (buffers[ndx].size > 0)
			{
				gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffers[ndx].buffer);
				mapPtrs[ndx] = gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, buffers[ndx].size, access);
				GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to map buffer");
				TCU_CHECK(mapPtrs[ndx]);
			}
			else
				mapPtrs[ndx] = DE_NULL;
		}

		return mapPtrs;
	}
	catch (...)
	{
		for (int ndx = 0; ndx < (int)buffers.size(); ndx++)
		{
			if (mapPtrs[ndx])
			{
				gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, buffers[ndx].buffer);
				gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
			}
		}

		throw;
	}
}